

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall QRhiGles2::dispatch(QRhiGles2 *this,QRhiCommandBuffer *cb,int x,int y,int z)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  Span *pSVar4;
  Entry *pEVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *pDVar10;
  char *pcVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  char **this_00;
  long in_FS_OFFSET;
  piter pVar21;
  piter it;
  QRhiResource *local_50;
  QRhiResource *local_48;
  pair<int,_bool> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (cb[5].super_QRhiResource.m_objectName.d.size == 0) goto LAB_0057a9c5;
  this_00 = &cb[0x11].super_QRhiResource.m_objectName.d.ptr;
  pDVar10 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
            cb[0x11].super_QRhiResource.m_objectName.d.ptr;
  if (pDVar10 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) {
    pcVar11 = (char *)0x0;
LAB_0057a628:
    uVar13 = 0;
  }
  else {
    if (1 < (uint)(pDVar10->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar10 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
                detached(pDVar10);
      *this_00 = (char *)pDVar10;
    }
    pcVar11 = *this_00;
    if (**(char **)(pcVar11 + 0x20) != -1) goto LAB_0057a628;
    uVar14 = 1;
    do {
      uVar13 = uVar14;
      if (*(ulong *)(pcVar11 + 0x10) == uVar13) {
        pcVar11 = (char *)0x0;
        uVar13 = 0;
        break;
      }
      uVar14 = uVar13 + 1;
    } while ((*(char **)(pcVar11 + 0x20))[(ulong)((uint)uVar13 & 0x7f) + (uVar13 >> 7) * 0x90] == -1
            );
  }
  if (uVar13 != 0 || pcVar11 != (char *)0x0) {
    do {
      lVar15 = *(long *)(pcVar11 + 0x20);
      lVar20 = (uVar13 >> 7) * 0x90;
      lVar19 = *(long *)(lVar15 + 0x80 + lVar20);
      lVar20 = (ulong)*(byte *)((ulong)((uint)uVar13 & 0x7f) + lVar15 + lVar20) * 0x10;
      *(undefined4 *)(lVar19 + 8 + lVar20) = 0;
      *(undefined1 *)(lVar19 + 0xc + lVar20) = 0;
      do {
        if (*(long *)(pcVar11 + 0x10) - 1U == uVar13) {
          uVar13 = 0;
          pcVar11 = (char *)0x0;
          break;
        }
        uVar13 = uVar13 + 1;
      } while (*(char *)((ulong)((uint)uVar13 & 0x7f) + (uVar13 >> 7) * 0x90 + lVar15) == -1);
    } while ((uVar13 != 0) || (pcVar11 != (char *)0x0));
  }
  lVar15 = cb[5].super_QRhiResource.m_objectName.d.size;
  uVar18 = (uint)*(undefined8 *)(lVar15 + 0x38);
  if (0 < (int)uVar18) {
    uVar13 = (ulong)(uVar18 & 0x7fffffff);
    lVar19 = 0x10;
    do {
      lVar20 = *(long *)(lVar15 + 0x40);
      uVar18 = *(uint *)(lVar20 + -8 + lVar19);
      if (uVar18 - 7 < 3) {
        local_50 = *(QRhiResource **)(lVar20 + lVar19);
        uVar16 = uVar18 == 9 | 2;
        if (uVar18 == 7) {
          uVar16 = 1;
        }
        pVar21 = (piter)QHash<QRhiResource*,std::pair<int,bool>>::findImpl<QRhiResource*>
                                  ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_50);
        if (pVar21.d == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
            pVar21.bucket == 0) {
          if ((uVar18 & 0xfffffffe) == 8) {
LAB_0057a7ae:
            local_40.first = uVar16;
            local_40.second = true;
            local_48 = local_50;
            QHash<QRhiResource*,std::pair<int,bool>>::emplace<std::pair<int,bool>const&>
                      ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_48,&local_40);
          }
        }
        else {
LAB_0057a775:
          pSVar4 = (pVar21.d)->spans;
          uVar14 = pVar21.bucket >> 7;
          puVar1 = pSVar4[uVar14].entries[pSVar4[uVar14].offsets[(uint)pVar21.bucket & 0x7f]].
                   storage.data + 8;
          *(uint *)puVar1 = *(uint *)puVar1 | uVar16;
        }
      }
      else if (uVar18 - 4 < 3) {
        local_50 = *(QRhiResource **)(lVar20 + lVar19);
        uVar16 = uVar18 == 6 | 2;
        if (uVar18 == 4) {
          uVar16 = 1;
        }
        pVar21 = (piter)QHash<QRhiResource*,std::pair<int,bool>>::findImpl<QRhiResource*>
                                  ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_50);
        if (pVar21.d != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 ||
            pVar21.bucket != 0) goto LAB_0057a775;
        if (uVar18 - 5 < 2) goto LAB_0057a7ae;
      }
      lVar19 = lVar19 + 0x118;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  pDVar10 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)*this_00;
  uVar18 = 0;
  if (pDVar10 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) {
    pDVar10 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
    sVar17 = 0;
  }
  else {
    if (1 < (uint)(pDVar10->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar10 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
                detached(pDVar10);
      *this_00 = (char *)pDVar10;
    }
    pDVar10 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)*this_00;
    if (pDVar10->spans->offsets[0] == 0xff) {
      uVar13 = 1;
      do {
        sVar17 = uVar13;
        if (pDVar10->numBuckets == sVar17) {
          pDVar10 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
          sVar17 = 0;
          break;
        }
        uVar13 = sVar17 + 1;
      } while (pDVar10->spans[sVar17 >> 7].offsets[(uint)sVar17 & 0x7f] == 0xff);
    }
    else {
      sVar17 = 0;
    }
  }
  it.bucket = sVar17;
  it.d = pDVar10;
  if (pDVar10 != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 ||
      sVar17 != 0) {
    uVar18 = 0;
    do {
      uVar13 = it.bucket;
      pDVar10 = it.d;
      pEVar5 = pDVar10->spans[uVar13 >> 7].entries;
      bVar2 = pDVar10->spans[uVar13 >> 7].offsets[(uint)it.bucket & 0x7f];
      iVar3 = *(int *)(pEVar5[bVar2].storage.data + 8);
      if ((iVar3 != 0) && (pEVar5[bVar2].storage.data[0xc] == '\0')) {
        iVar9 = (**(code **)(**(long **)pEVar5[bVar2].storage.data + 0x10))();
        if (iVar9 == 1) {
          uVar18 = uVar18 | 0x20;
        }
        else {
          uVar18 = uVar18 | 0x2000;
        }
      }
      if (iVar3 == 1) {
        it = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::erase
                              ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00,
                               (const_iterator)it);
      }
      else {
        do {
          if (pDVar10->numBuckets - 1 == uVar13) {
            it = (piter)ZEXT816(0);
            break;
          }
          uVar13 = uVar13 + 1;
          it.bucket = uVar13;
          it.d = pDVar10;
        } while (pDVar10->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
      }
    } while ((it.d != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) ||
            (it.bucket != 0));
  }
  if (uVar18 != 0) {
    iVar3 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
    iVar9 = *(int *)&cb[1].super_QRhiResource.m_rhi;
    if (iVar3 == iVar9) {
      uVar13 = (long)iVar9 + 0x400;
      *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar13;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar13;
      uVar13 = 0xffffffffffffffff;
      if (SUB168(auVar7 * ZEXT816(0x68),8) == 0) {
        uVar13 = SUB168(auVar7 * ZEXT816(0x68),0);
      }
      pp_Var12 = (_func_int **)operator_new__(uVar13);
      pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
      if (pp_Var6 != (_func_int **)0x0) {
        memcpy(pp_Var12,pp_Var6,(long)iVar3 * 0x68);
        operator_delete__(pp_Var6);
      }
      cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var12;
    }
    pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
    iVar3 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
    *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar3 + 1;
    *(undefined4 *)(pp_Var6 + (long)iVar3 * 0xd) = 0x1c;
    *(uint *)(pp_Var6 + (long)iVar3 * 0xd + 1) = uVar18;
  }
LAB_0057a9c5:
  iVar3 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
  iVar9 = *(int *)&cb[1].super_QRhiResource.m_rhi;
  if (iVar3 == iVar9) {
    uVar13 = (long)iVar9 + 0x400;
    *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar13;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar13;
    uVar13 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x68),8) == 0) {
      uVar13 = SUB168(auVar8 * ZEXT816(0x68),0);
    }
    pp_Var12 = (_func_int **)operator_new__(uVar13);
    pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
    if (pp_Var6 != (_func_int **)0x0) {
      memcpy(pp_Var12,pp_Var6,(long)iVar3 * 0x68);
      operator_delete__(pp_Var6);
    }
    cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var12;
  }
  pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
  iVar3 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
  lVar15 = (long)iVar3;
  *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar3 + 1;
  *(undefined4 *)(pp_Var6 + lVar15 * 0xd) = 0x1a;
  *(int *)(pp_Var6 + lVar15 * 0xd + 1) = x;
  *(int *)((long)pp_Var6 + lVar15 * 0x68 + 0xc) = y;
  *(int *)(pp_Var6 + lVar15 * 0xd + 2) = z;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::dispatch(QRhiCommandBuffer *cb, int x, int y, int z)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::ComputePass);

    if (cbD->currentComputeSrb) {
        GLbitfield barriers = 0;

        // The key in the writtenResources map indicates that the resource was
        // written in a previous dispatch, whereas the value accumulates the
        // access mask in the current one.
        for (auto &accessAndIsNewFlag : cbD->computePassState.writtenResources)
            accessAndIsNewFlag = { 0, false };

        QGles2ShaderResourceBindings *srbD = QRHI_RES(QGles2ShaderResourceBindings, cbD->currentComputeSrb);
        const int bindingCount = srbD->m_bindings.size();
        for (int i = 0; i < bindingCount; ++i) {
            const QRhiShaderResourceBinding::Data *b = shaderResourceBindingData(srbD->m_bindings.at(i));
            switch (b->type) {
            case QRhiShaderResourceBinding::ImageLoad:
            case QRhiShaderResourceBinding::ImageStore:
            case QRhiShaderResourceBinding::ImageLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.simage.tex,
                                                 b->type,
                                                 QRhiShaderResourceBinding::ImageLoad,
                                                 QRhiShaderResourceBinding::ImageStore,
                                                 QRhiShaderResourceBinding::ImageLoadStore);
                break;
            case QRhiShaderResourceBinding::BufferLoad:
            case QRhiShaderResourceBinding::BufferStore:
            case QRhiShaderResourceBinding::BufferLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.sbuf.buf,
                                                 b->type,
                                                 QRhiShaderResourceBinding::BufferLoad,
                                                 QRhiShaderResourceBinding::BufferStore,
                                                 QRhiShaderResourceBinding::BufferLoadStore);
                break;
            default:
                break;
            }
        }

        for (auto it = cbD->computePassState.writtenResources.begin(); it != cbD->computePassState.writtenResources.end(); ) {
            const int accessInThisDispatch = it->first;
            const bool isNewInThisDispatch = it->second;
            if (accessInThisDispatch && !isNewInThisDispatch) {
                if (it.key()->resourceType() == QRhiResource::Texture)
                    barriers |= GL_SHADER_IMAGE_ACCESS_BARRIER_BIT;
                else
                    barriers |= GL_SHADER_STORAGE_BARRIER_BIT;
            }
            // Anything that was previously written, but is only read now, can be
            // removed from the written list (because that previous write got a
            // corresponding barrier now).
            if (accessInThisDispatch == QGles2CommandBuffer::ComputePassState::Read)
                it = cbD->computePassState.writtenResources.erase(it);
            else
                ++it;
        }

        if (barriers) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::Barrier;
            cmd.args.barrier.barriers = barriers;
        }
    }

    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
    cmd.cmd = QGles2CommandBuffer::Command::Dispatch;
    cmd.args.dispatch.x = GLuint(x);
    cmd.args.dispatch.y = GLuint(y);
    cmd.args.dispatch.z = GLuint(z);
}